

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_loader_impl.cpp
# Opt level: O2

int ext_loader_impl_initialize_types(loader_impl impl)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  type_id index;
  uint uVar4;
  
  uVar4 = 0;
  do {
    if (uVar4 == 0x13) {
LAB_0010367e:
      return (int)(uVar4 < 0x13);
    }
    uVar2 = type_id_name(uVar4);
    lVar3 = type_create(uVar4,uVar2,0,0);
    if (lVar3 != 0) {
      uVar2 = type_name(lVar3);
      iVar1 = loader_impl_type_define(impl,uVar2,lVar3);
      if (iVar1 != 0) {
        type_destroy(lVar3);
        goto LAB_0010367e;
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

int ext_loader_impl_initialize_types(loader_impl impl)
{
	for (type_id index = 0; index < TYPE_SIZE; ++index)
	{
		type t = type_create(index, type_id_name(index), NULL, NULL);

		if (t != NULL)
		{
			if (loader_impl_type_define(impl, type_name(t), t) != 0)
			{
				type_destroy(t);
				return 1;
			}
		}
	}

	return 0;
}